

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_client_connection.c
# Opt level: O2

apx_error_t apx_clientConnection_unix_connect(apx_clientSocketConnection_t *self,char *socket_path)

{
  int8_t iVar1;
  apx_error_t aVar2;
  msocket_t *socket_object;
  
  if (self != (apx_clientSocketConnection_t *)0x0) {
    socket_object = msocket_new('\x01');
    if (socket_object == (msocket_t *)0x0) {
      aVar2 = 2;
    }
    else {
      register_msocket_handler(self,socket_object);
      iVar1 = msocket_unix_connect(socket_object,socket_path);
      if (iVar1 == '\0') {
        aVar2 = 0;
      }
      else {
        msocket_delete(socket_object);
        self->socket_object = (msocket_t *)0x0;
        aVar2 = 0x22;
      }
    }
    return aVar2;
  }
  return 1;
}

Assistant:

apx_error_t apx_clientConnection_unix_connect(apx_clientSocketConnection_t *self, const char *socket_path)
{
   if (self != 0)
   {
      apx_error_t retval = APX_NO_ERROR;
      msocket_t *socket_object = msocket_new(AF_LOCAL);
      if (socket_object != 0)
      {
         int8_t result = 0;
         register_msocket_handler(self, socket_object);
         result = msocket_unix_connect(socket_object, socket_path);
         if (result != 0)
         {
            msocket_delete(socket_object);
            self->socket_object = (SOCKET_TYPE*) 0;
            retval = APX_CONNECTION_ERROR;
         }
         else
         {

         }
      }
      else
      {
         retval = APX_MEM_ERROR;
      }
      return retval;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}